

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_util.c
# Opt level: O0

int difference_uint16(uint16_t *a1,int length1,uint16_t *a2,int length2,uint16_t *a_out)

{
  int in_ECX;
  ushort *in_RDX;
  int in_ESI;
  ushort *in_RDI;
  ushort *in_R8;
  uint16_t s2;
  uint16_t s1;
  int k2;
  int k1;
  int out_card;
  ushort local_40;
  ushort local_3e;
  int local_3c;
  int local_38;
  int local_34;
  int local_4;
  
  local_34 = 0;
  local_38 = 0;
  local_3c = 0;
  if (in_ESI == 0) {
    local_4 = 0;
  }
  else {
    if (in_ECX != 0) {
      local_3e = *in_RDI;
      local_40 = *in_RDX;
      do {
        while (local_3e < local_40) {
          in_R8[local_34] = local_3e;
          local_38 = local_38 + 1;
          if (in_ESI <= local_38) {
            return local_34 + 1;
          }
          local_34 = local_34 + 1;
          local_3e = in_RDI[local_38];
        }
        if (local_3e == local_40) {
          local_38 = local_38 + 1;
          if (in_ESI <= local_38) {
            return local_34;
          }
          if (in_ECX <= local_3c + 1) {
            memmove(in_R8 + local_34,in_RDI + local_38,(long)(in_ESI - local_38) << 1);
            return (local_34 + in_ESI) - local_38;
          }
          local_3e = in_RDI[local_38];
          local_40 = in_RDX[local_3c + 1];
        }
        else {
          if (in_ECX <= local_3c + 1) {
            memmove(in_R8 + local_34,in_RDI + local_38,(long)(in_ESI - local_38) << 1);
            return (local_34 + in_ESI) - local_38;
          }
          local_40 = in_RDX[local_3c + 1];
        }
        local_3c = local_3c + 1;
      } while( true );
    }
    local_4 = in_ESI;
    if (in_RDI != in_R8) {
      memcpy(in_R8,in_RDI,(long)in_ESI << 1);
    }
  }
  return local_4;
}

Assistant:

int difference_uint16(const uint16_t *a1, int length1, const uint16_t *a2,
                      int length2, uint16_t *a_out) {
    int out_card = 0;
    int k1 = 0, k2 = 0;
    if (length1 == 0) return 0;
    if (length2 == 0) {
        if (a1 != a_out) memcpy(a_out, a1, sizeof(uint16_t) * length1);
        return length1;
    }
    uint16_t s1 = a1[k1];
    uint16_t s2 = a2[k2];
    while (true) {
        if (s1 < s2) {
            a_out[out_card++] = s1;
            ++k1;
            if (k1 >= length1) {
                break;
            }
            s1 = a1[k1];
        } else if (s1 == s2) {
            ++k1;
            ++k2;
            if (k1 >= length1) {
                break;
            }
            if (k2 >= length2) {
                memmove(a_out + out_card, a1 + k1,
                        sizeof(uint16_t) * (length1 - k1));
                return out_card + length1 - k1;
            }
            s1 = a1[k1];
            s2 = a2[k2];
        } else {  // if (val1>val2)
            ++k2;
            if (k2 >= length2) {
                memmove(a_out + out_card, a1 + k1,
                        sizeof(uint16_t) * (length1 - k1));
                return out_card + length1 - k1;
            }
            s2 = a2[k2];
        }
    }
    return out_card;
}